

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatecode.c
# Opt level: O0

void generate_code_for_list(List *ls,int m68kop,ParsedOpcodeInfo *info,CCVariant *var)

{
  TokenType TVar1;
  List *ls_00;
  anon_union_8_7_0ba269be_for_u aVar2;
  unsigned_long uVar3;
  undefined4 uVar4;
  BOOL BVar5;
  int iVar6;
  Token *t_00;
  char *pcVar7;
  undefined8 uVar8;
  bool bVar9;
  Token temp_2;
  Token temp_1;
  Token temp;
  List *l2;
  int32 val;
  TokenType optype;
  BOOL done;
  Token *t;
  char buf [512];
  CCVariant *var_local;
  ParsedOpcodeInfo *info_local;
  ListStruct *pLStack_10;
  int m68kop_local;
  List *ls_local;
  
  if (ls != (List *)0x0) {
    t_00 = &ls->token;
    buf._504_8_ = var;
    switch(t_00->type) {
    case TOK_FALSE:
      fputs("0 ",(FILE *)syn68k_c_stream);
      break;
    case TOK_TRUE:
      fputs("1 ",(FILE *)syn68k_c_stream);
      break;
    default:
      pcVar7 = unparse_token(t_00,(char *)&t);
      parse_error(ls,"Unknown code element: %s\n",pcVar7);
      break;
    case TOK_DOLLAR_DATA_REGISTER:
      TVar1 = t_00->type;
      uVar4 = *(undefined4 *)&t_00->field_0x4;
      aVar2 = (ls->token).u;
      pcVar7 = (ls->token).filename;
      uVar3 = (ls->token).lineno;
      uVar8 = 0x55;
      if ((ls->token).u.reginfo.sgnd != '\0') {
        uVar8 = 0x53;
      }
      fprintf((FILE *)syn68k_c_stream,"DATA_REGISTER_%c%c (",uVar8,
              (ulong)(uint)(int)"?BW?L"[(ls->token).u.reginfo.size]);
      t_00->type = TOK_DOLLAR_NUMBER;
      (ls->token).u.reginfo.sgnd = '\0';
      (ls->token).u.reginfo.size = '\x04';
      generate_code_for_list(ls,m68kop,info,(CCVariant *)buf._504_8_);
      t_00->type = TVar1;
      *(undefined4 *)&t_00->field_0x4 = uVar4;
      (ls->token).u = aVar2;
      (ls->token).filename = pcVar7;
      (ls->token).lineno = uVar3;
      fputs(") ",(FILE *)syn68k_c_stream);
      break;
    case TOK_DOLLAR_ADDRESS_REGISTER:
      TVar1 = t_00->type;
      uVar4 = *(undefined4 *)&t_00->field_0x4;
      aVar2 = (ls->token).u;
      pcVar7 = (ls->token).filename;
      uVar3 = (ls->token).lineno;
      uVar8 = 0x55;
      if ((ls->token).u.reginfo.sgnd != '\0') {
        uVar8 = 0x53;
      }
      fprintf((FILE *)syn68k_c_stream,"ADDRESS_REGISTER_%c%c ( ",uVar8,
              (ulong)(uint)(int)"?BW?L"[(ls->token).u.reginfo.size]);
      t_00->type = TOK_DOLLAR_NUMBER;
      (ls->token).u.reginfo.sgnd = '\0';
      (ls->token).u.reginfo.size = '\x04';
      generate_code_for_list(ls,m68kop,info,(CCVariant *)buf._504_8_);
      t_00->type = TVar1;
      *(undefined4 *)&t_00->field_0x4 = uVar4;
      (ls->token).u = aVar2;
      (ls->token).filename = pcVar7;
      (ls->token).lineno = uVar3;
      fputs(") ",(FILE *)syn68k_c_stream);
      break;
    case TOK_DOLLAR_GENERAL_REGISTER:
      TVar1 = t_00->type;
      uVar4 = *(undefined4 *)&t_00->field_0x4;
      aVar2 = (ls->token).u;
      pcVar7 = (ls->token).filename;
      uVar3 = (ls->token).lineno;
      uVar8 = 0x55;
      if ((ls->token).u.reginfo.sgnd != '\0') {
        uVar8 = 0x53;
      }
      fprintf((FILE *)syn68k_c_stream,"GENERAL_REGISTER_%c%c (",uVar8,
              (ulong)(uint)(int)"?BW?L"[(ls->token).u.reginfo.size]);
      t_00->type = TOK_DOLLAR_NUMBER;
      (ls->token).u.reginfo.sgnd = '\0';
      (ls->token).u.reginfo.size = '\x04';
      generate_code_for_list(ls,m68kop,info,(CCVariant *)buf._504_8_);
      t_00->type = TVar1;
      *(undefined4 *)&t_00->field_0x4 = uVar4;
      (ls->token).u = aVar2;
      (ls->token).filename = pcVar7;
      (ls->token).lineno = uVar3;
      fputs(") ",(FILE *)syn68k_c_stream);
      break;
    case TOK_DOLLAR_AMODE:
      if ((ls->token).u.reginfo.size == '\x04') {
        uVar8 = 0x55;
        if ((ls->token).u.reginfo.sgnd != '\0') {
          uVar8 = 0x53;
        }
        fprintf((FILE *)syn68k_c_stream,"READ%cL_UNSWAPPED ( (cpu_state.amode_p)) ",uVar8);
      }
      else {
        fprintf((FILE *)syn68k_c_stream,"DEREF(%s, SYN68K_TO_US(cpu_state.amode_p)) ",
                ctypes[(ls->token).u.reginfo.sgnd][(ls->token).u.reginfo.size]);
      }
      break;
    case TOK_DOLLAR_REVERSED_AMODE:
      if ((ls->token).u.reginfo.size == '\x04') {
        uVar8 = 0x55;
        if ((ls->token).u.reginfo.sgnd != '\0') {
          uVar8 = 0x53;
        }
        fprintf((FILE *)syn68k_c_stream,"READ%cL_UNSWAPPED ( (cpu_state.reversed_amode_p)) ",uVar8);
      }
      else {
        fprintf((FILE *)syn68k_c_stream,"DEREF(%s, SYN68K_TO_US(cpu_state.reversed_amode_p)) ",
                ctypes[(ls->token).u.reginfo.sgnd][(ls->token).u.reginfo.size]);
      }
      break;
    case TOK_DOLLAR_NUMBER:
      fprintf((FILE *)syn68k_c_stream,"operand_%d ",(ulong)(ls->token).u.reginfo.which);
      break;
    case TOK_DOLLAR_AMODE_PTR:
      fprintf((FILE *)syn68k_c_stream," (cpu_state.amode_p) ");
      break;
    case TOK_DOLLAR_REVERSED_AMODE_PTR:
      fprintf((FILE *)syn68k_c_stream," (cpu_state.reversed_amode_p) ");
      break;
    case TOK_AMODE:
    case TOK_REVERSED_AMODE:
      if ((ls->token).u.reginfo.size == '\x04') {
        uVar8 = 0x55;
        if ((ls->token).u.reginfo.sgnd != '\0') {
          uVar8 = 0x53;
        }
        fprintf((FILE *)syn68k_c_stream,"READ%cL_UNSWAPPED (CLEAN",uVar8);
        output_c_for_amode_ptr(t_00,(uint)(t_00->type == TOK_REVERSED_AMODE));
        fputs(") ",(FILE *)syn68k_c_stream);
      }
      else {
        fprintf((FILE *)syn68k_c_stream,"DEREF(%s, CLEAN (",
                ctypes[(ls->token).u.reginfo.sgnd][(ls->token).u.reginfo.size]);
        output_c_for_amode_ptr(t_00,(uint)(t_00->type == TOK_REVERSED_AMODE));
        fputs(")) ",(FILE *)syn68k_c_stream);
      }
      break;
    case TOK_AMODE_PTR:
    case TOK_REVERSED_AMODE_PTR:
      fputs("(US_TO_SYN68K (",(FILE *)syn68k_c_stream);
      output_c_for_amode_ptr(t_00,(uint)(t_00->type == TOK_REVERSED_AMODE_PTR));
      fputs("))",(FILE *)syn68k_c_stream);
      break;
    case TOK_QUOTED_STRING:
      fprintf((FILE *)syn68k_c_stream,"%s ",(ls->token).u.string);
      break;
    case TOK_NUMBER:
      if (((ls->token).u.n < 100) && (-100 < (ls->token).u.n)) {
        fprintf((FILE *)syn68k_c_stream,"%ld ",(ls->token).u.string);
      }
      else {
        fprintf((FILE *)syn68k_c_stream,"((int32) 0x%lX) ",(ls->token).u.string);
      }
      break;
    case TOK_DATA_REGISTER:
      uVar8 = 0x55;
      if ((ls->token).u.reginfo.sgnd != '\0') {
        uVar8 = 0x53;
      }
      fprintf((FILE *)syn68k_c_stream,"DATA_REGISTER_%c%c (%d) ",uVar8,
              (ulong)(uint)(int)"?BW?L"[(ls->token).u.reginfo.size],
              (ulong)(ls->token).u.reginfo.which);
      break;
    case TOK_ADDRESS_REGISTER:
      uVar8 = 0x55;
      if ((ls->token).u.reginfo.sgnd != '\0') {
        uVar8 = 0x53;
      }
      fprintf((FILE *)syn68k_c_stream,"ADDRESS_REGISTER_%c%c (%d) ",uVar8,
              (ulong)(uint)(int)"?BW?L"[(ls->token).u.reginfo.size],
              (ulong)(ls->token).u.reginfo.which);
      break;
    case TOK_TEMP_REGISTER:
      fprintf((FILE *)syn68k_c_stream,"tmp%d%s ",(ulong)(ls->token).u.reginfo.which,
              regdesc[(ls->token).u.reginfo.sgnd][(ls->token).u.reginfo.size]);
      break;
    case TOK_NOP:
      break;
    case TOK_CCC:
      fputs("cpu_state.ccc ",(FILE *)syn68k_c_stream);
      break;
    case TOK_CCN:
      fputs("cpu_state.ccn ",(FILE *)syn68k_c_stream);
      break;
    case TOK_CCV:
      fputs("cpu_state.ccv ",(FILE *)syn68k_c_stream);
      break;
    case TOK_CCX:
      fputs("cpu_state.ccx ",(FILE *)syn68k_c_stream);
      break;
    case TOK_CCNZ:
      fputs("cpu_state.ccnz ",(FILE *)syn68k_c_stream);
      break;
    case TOK_CODE:
      fputs("code ",(FILE *)syn68k_c_stream);
      break;
    case TOK_LIST:
      if (ls->car != (ListStruct *)0x0) {
        ls_00 = ls->car;
        switch((ls_00->token).type) {
        case TOK_IF:
          fputs("if (",(FILE *)syn68k_c_stream);
          generate_code_for_list(ls_00->cdr,m68kop,info,(CCVariant *)buf._504_8_);
          fputs(") { ",(FILE *)syn68k_c_stream);
          generate_code_for_list(ls_00->cdr->cdr,m68kop,info,(CCVariant *)buf._504_8_);
          fputs(";} ",(FILE *)syn68k_c_stream);
          if (ls_00->cdr->cdr->cdr != (ListStruct *)0x0) {
            fputs("else { ",(FILE *)syn68k_c_stream);
            generate_code_for_list(ls_00->cdr->cdr->cdr,m68kop,info,(CCVariant *)buf._504_8_);
            fputs(";} ",(FILE *)syn68k_c_stream);
          }
          break;
        case TOK_SWITCH:
          fputs("switch (",(FILE *)syn68k_c_stream);
          generate_code_for_list(ls_00->cdr,m68kop,info,(CCVariant *)buf._504_8_);
          fputs(") {\n",(FILE *)syn68k_c_stream);
          for (pLStack_10 = ls_00->cdr->cdr; pLStack_10 != (ListStruct *)0x0;
              pLStack_10 = pLStack_10->cdr) {
            if ((pLStack_10->car->token).type == TOK_DEFAULT) {
              fputs("        default: ",(FILE *)syn68k_c_stream);
            }
            else {
              fputs("        case ",(FILE *)syn68k_c_stream);
              generate_code_for_list(pLStack_10->car,m68kop,info,(CCVariant *)buf._504_8_);
              fputs(": ",(FILE *)syn68k_c_stream);
            }
            generate_code_for_list(pLStack_10->car->cdr,m68kop,info,(CCVariant *)buf._504_8_);
            fputs("; break;\n",(FILE *)syn68k_c_stream);
          }
          fputs("}\n        ",(FILE *)syn68k_c_stream);
          break;
        case TOK_DEFAULT:
          fputs("default ",(FILE *)syn68k_c_stream);
          break;
        case TOK_AND:
          binary_op_list("&&",ls_00->cdr,m68kop,info,var);
          break;
        case TOK_OR:
          binary_op_list("||",ls_00->cdr,m68kop,info,var);
          break;
        case TOK_XOR:
          for (pLStack_10 = ls_00->cdr; pLStack_10 != (List *)0x0; pLStack_10 = pLStack_10->cdr) {
            fputs("(!",(FILE *)syn68k_c_stream);
            generate_code_for_list(pLStack_10,m68kop,info,(CCVariant *)buf._504_8_);
            fputs(") ",(FILE *)syn68k_c_stream);
            if (pLStack_10->cdr != (ListStruct *)0x0) {
              fputs("^ ",(FILE *)syn68k_c_stream);
            }
          }
          break;
        case TOK_NOT:
          if (ls_00->cdr == (ListStruct *)0x0) {
            parse_error(ls_00,"\"not\" missing an argument!\n");
            fputs("0 ",(FILE *)syn68k_c_stream);
          }
          else {
            fputs("(!",(FILE *)syn68k_c_stream);
            generate_code_for_list(ls_00->cdr,m68kop,info,(CCVariant *)buf._504_8_);
            fputs(") ",(FILE *)syn68k_c_stream);
          }
          break;
        case TOK_EQUAL:
          binary_op_list("==",ls_00->cdr,m68kop,info,var);
          break;
        case TOK_NOT_EQUAL:
          binary_op_list("!=",ls_00->cdr,m68kop,info,var);
          break;
        case TOK_GREATER_THAN:
        case TOK_LESS_THAN:
        case TOK_GREATER_OR_EQUAL:
        case TOK_LESS_OR_EQUAL:
        case TOK_PLUS:
        case TOK_MINUS:
        case TOK_MULTIPLY:
        case TOK_DIVIDE:
        case TOK_MOD:
        case TOK_BITWISE_AND:
        case TOK_BITWISE_OR:
        case TOK_BITWISE_XOR:
          unparse_token(&ls_00->token,(char *)&t);
          binary_op_list((char *)&t,ls_00->cdr,m68kop,info,(CCVariant *)buf._504_8_);
          break;
        default:
          pcVar7 = unparse_token(&ls_00->token,(char *)&t);
          parse_error(ls_00,"Unknown operator for code list: %s\n",pcVar7);
          break;
        case TOK_NOP:
          break;
        case TOK_SHIFT_LEFT:
        case TOK_SHIFT_RIGHT:
          unparse_token(&ls_00->token,(char *)&t);
          binary_op_list((char *)&t,ls_00->cdr,m68kop,info,(CCVariant *)buf._504_8_);
          break;
        case TOK_ASSIGN:
          putc(0x28,(FILE *)syn68k_c_stream);
          bVar9 = false;
          if ((((ls_00->cdr->token).type == TOK_LIST) &&
              ((ls_00->cdr->car->token).type == TOK_DEREF)) &&
             ((ls_00->cdr->car->token).u.reginfo.size == '\x04')) {
            uVar8 = 0x55;
            if ((ls_00->cdr->car->token).u.reginfo.sgnd != '\0') {
              uVar8 = 0x53;
            }
            fprintf((FILE *)syn68k_c_stream,"WRITE%cL_UNSWAPPED (SYN68K_TO_US (CLEAN (",uVar8);
            generate_code_for_list(ls_00->cdr->car->cdr,m68kop,info,(CCVariant *)buf._504_8_);
            fputs(")), ",(FILE *)syn68k_c_stream);
            generate_code_for_list(ls_00->cdr->cdr,m68kop,info,(CCVariant *)buf._504_8_);
            fputs(") ",(FILE *)syn68k_c_stream);
            bVar9 = true;
          }
          if (((((ls_00->cdr->token).type == TOK_AMODE) ||
               ((ls_00->cdr->token).type == TOK_REVERSED_AMODE)) ||
              (((ls_00->cdr->token).type == TOK_DOLLAR_AMODE ||
               ((ls_00->cdr->token).type == TOK_DOLLAR_REVERSED_AMODE)))) &&
             ((ls_00->cdr->token).u.reginfo.size == '\x04')) {
            bVar9 = (ls_00->cdr->token).u.reginfo.sgnd == '\0';
            fprintf((FILE *)syn68k_c_stream,"WRITE%cL_UNSWAPPED (SYN68K_TO_US (CLEAN (",
                    (ulong)(bVar9 + 0x53 + (uint)bVar9));
            switch((ls_00->cdr->token).type) {
            case TOK_DOLLAR_AMODE:
              fputs(" (cpu_state.amode_p) ",(FILE *)syn68k_c_stream);
              break;
            case TOK_DOLLAR_REVERSED_AMODE:
              fputs(" (cpu_state.reversed_amode_p) ",(FILE *)syn68k_c_stream);
              break;
            case TOK_AMODE:
              (ls_00->cdr->token).type = TOK_AMODE_PTR;
              generate_code_for_list(ls_00->cdr,m68kop,info,(CCVariant *)buf._504_8_);
              (ls_00->cdr->token).type = TOK_AMODE;
              break;
            case TOK_REVERSED_AMODE:
            default:
              (ls_00->cdr->token).type = TOK_REVERSED_AMODE_PTR;
              generate_code_for_list(ls_00->cdr,m68kop,info,(CCVariant *)buf._504_8_);
              (ls_00->cdr->token).type = TOK_REVERSED_AMODE;
            }
            fputs(")), ",(FILE *)syn68k_c_stream);
            generate_code_for_list(ls_00->cdr->cdr,m68kop,info,(CCVariant *)buf._504_8_);
            fputs(") ",(FILE *)syn68k_c_stream);
            bVar9 = true;
          }
          if ((((!bVar9) && ((ls_00->cdr->cdr->token).type == TOK_LIST)) &&
              (((iVar6 = list_length(ls_00->cdr->cdr->car), iVar6 == 3 &&
                (BVar5 = tokens_equal(&ls_00->cdr->cdr->car->cdr->token,&ls_00->cdr->token),
                BVar5 != FALSE)) &&
               (((ls_00->cdr->token).type != TOK_LIST ||
                (BVar5 = lists_equal(ls_00->cdr->car,ls_00->cdr->cdr->car->cdr->car), BVar5 != FALSE
                )))))) &&
             ((TVar1 = (ls_00->cdr->cdr->car->token).type, TVar1 - TOK_SHIFT_LEFT < 2 ||
              (TVar1 - TOK_PLUS < 8)))) {
            if (((ls_00->cdr->token).type == TOK_ADDRESS_REGISTER) &&
               ((ls_00->cdr->token).u.reginfo.size == '\x02')) {
              (ls_00->cdr->token).u.reginfo.size = '\x04';
              generate_code_for_list(ls_00->cdr,m68kop,info,(CCVariant *)buf._504_8_);
              pcVar7 = unparse_token(&ls_00->cdr->cdr->car->token,(char *)&t);
              fputs(pcVar7,(FILE *)syn68k_c_stream);
              fputs("= (int16)",(FILE *)syn68k_c_stream);
              generate_code_for_list
                        (ls_00->cdr->cdr->car->cdr->cdr,m68kop,info,(CCVariant *)buf._504_8_);
            }
            else {
              TVar1 = (ls_00->cdr->cdr->car->token).type;
              if ((((TVar1 == TOK_PLUS) || (TVar1 == TOK_MINUS)) &&
                  ((ls_00->cdr->cdr->car->cdr->cdr->token).type == TOK_NUMBER)) &&
                 (((ls_00->cdr->cdr->car->cdr->cdr->token).u.string == (char *)0x1 ||
                  ((ls_00->cdr->cdr->car->cdr->cdr->token).u.string == (char *)0xffffffffffffffff)))
                 ) {
                if ((TVar1 == TOK_PLUS) ==
                    ((ls_00->cdr->cdr->car->cdr->cdr->token).u.string == (char *)0xffffffffffffffff)
                   ) {
                  fputs("(--",(FILE *)syn68k_c_stream);
                }
                else {
                  fputs("(++",(FILE *)syn68k_c_stream);
                }
                generate_code_for_list(ls_00->cdr,m68kop,info,(CCVariant *)buf._504_8_);
                fputs(") ",(FILE *)syn68k_c_stream);
              }
              else if (((TVar1 == TOK_PLUS) || (TVar1 == TOK_MINUS)) &&
                      ((((ls_00->cdr->cdr->car->cdr->cdr->token).type == TOK_NUMBER &&
                        ((ls_00->cdr->token).u.reginfo.size == '\x04')) &&
                       ((ls_00->cdr->token).u.string != (char *)0xffffffff80000000)))) {
                iVar6 = (int)(ls_00->cdr->cdr->car->cdr->cdr->token).u.n;
                if (iVar6 < 0) {
                  if (TVar1 == TOK_PLUS) {
                    fputs("(DEC_VAR (",(FILE *)syn68k_c_stream);
                  }
                  else {
                    fputs("(INC_VAR (",(FILE *)syn68k_c_stream);
                  }
                  generate_code_for_list(ls_00->cdr,m68kop,info,(CCVariant *)buf._504_8_);
                  fprintf((FILE *)syn68k_c_stream,", %ld)) ",(long)-iVar6);
                }
                else {
                  if (TVar1 == TOK_PLUS) {
                    fputs("(INC_VAR (",(FILE *)syn68k_c_stream);
                  }
                  else {
                    fputs("(DEC_VAR (",(FILE *)syn68k_c_stream);
                  }
                  generate_code_for_list(ls_00->cdr,m68kop,info,(CCVariant *)buf._504_8_);
                  fprintf((FILE *)syn68k_c_stream,", %ld)) ",(long)iVar6);
                }
              }
              else {
                generate_code_for_list(ls_00->cdr,m68kop,info,(CCVariant *)buf._504_8_);
                pcVar7 = unparse_token(&ls_00->cdr->cdr->car->token,(char *)&t);
                fputs(pcVar7,(FILE *)syn68k_c_stream);
                fputs("= ",(FILE *)syn68k_c_stream);
                generate_code_for_list
                          (ls_00->cdr->cdr->car->cdr->cdr,m68kop,info,(CCVariant *)buf._504_8_);
              }
            }
            bVar9 = true;
          }
          if (((!bVar9) &&
              (BVar5 = tokens_equal(&ls_00->cdr->token,&ls_00->cdr->cdr->token), BVar5 != FALSE)) &&
             (BVar5 = lists_equal(ls_00->cdr->car,ls_00->cdr->cdr->car), BVar5 != FALSE)) {
            generate_code_for_list(ls_00->cdr,m68kop,info,(CCVariant *)buf._504_8_);
            bVar9 = true;
          }
          if (!bVar9) {
            if (((ls_00->cdr->token).type == TOK_ADDRESS_REGISTER) &&
               ((ls_00->cdr->token).u.reginfo.size == '\x02')) {
              (ls_00->cdr->token).u.reginfo.size = '\x04';
              generate_code_for_list(ls_00->cdr,m68kop,info,(CCVariant *)buf._504_8_);
              fputs("= (int16) ",(FILE *)syn68k_c_stream);
            }
            else {
              generate_code_for_list(ls_00->cdr,m68kop,info,(CCVariant *)buf._504_8_);
              fputs("= ",(FILE *)syn68k_c_stream);
            }
            generate_code_for_list(ls_00->cdr->cdr,m68kop,info,(CCVariant *)buf._504_8_);
          }
          fputs(") ",(FILE *)syn68k_c_stream);
          break;
        case TOK_BITWISE_NOT:
          if (ls_00->cdr == (ListStruct *)0x0) {
            parse_error(ls_00,"\"~\" missing an argument!\n");
            fputs("0 ",(FILE *)syn68k_c_stream);
          }
          else {
            fputs("(~",(FILE *)syn68k_c_stream);
            generate_code_for_list(ls_00->cdr,m68kop,info,(CCVariant *)buf._504_8_);
            fputs(") ",(FILE *)syn68k_c_stream);
          }
          break;
        case TOK_FUNC_CALL:
          if ((ls_00->cdr == (ListStruct *)0x0) || ((ls_00->cdr->token).type != TOK_QUOTED_STRING))
          {
            parse_error(ls_00,"\"call\" must be followed by a function name in quotes.\n");
          }
          else {
            fprintf((FILE *)syn68k_c_stream,"%s (",(ls_00->cdr->token).u.string);
            for (temp.lineno = (unsigned_long)ls_00->cdr->cdr; temp.lineno != 0;
                temp.lineno = *(unsigned_long *)temp.lineno) {
              generate_code_for_list((List *)temp.lineno,m68kop,info,(CCVariant *)buf._504_8_);
              if (*(long *)temp.lineno != 0) {
                fputs(", ",(FILE *)syn68k_c_stream);
              }
            }
            fputs(") ",(FILE *)syn68k_c_stream);
          }
          break;
        case TOK_CAST:
          if ((ls_00->cdr == (ListStruct *)0x0) || ((ls_00->cdr->token).type != TOK_QUOTED_STRING))
          {
            parse_error(ls_00,"\"cast\" must be followed by a C type in quotes.\n");
          }
          else {
            fprintf((FILE *)syn68k_c_stream,"((%s) ",(ls_00->cdr->token).u.string);
            generate_code_for_list(ls_00->cdr->cdr,m68kop,info,(CCVariant *)buf._504_8_);
            fputs(") ",(FILE *)syn68k_c_stream);
          }
          break;
        case TOK_DEREF:
          if ((ls_00->token).u.reginfo.size == '\0') {
            iVar6 = list_length(ls_00);
            if (iVar6 == 4) {
              if ((ls_00->cdr->token).type == TOK_QUOTED_STRING) {
                fprintf((FILE *)syn68k_c_stream,"(*(((%s) ",(ls_00->cdr->token).u.string);
                generate_code_for_list(ls_00->cdr->cdr,m68kop,info,(CCVariant *)buf._504_8_);
                fputs(") + ",(FILE *)syn68k_c_stream);
                generate_code_for_list(ls_00->cdr->cdr->cdr,m68kop,info,(CCVariant *)buf._504_8_);
                fputs(")) ",(FILE *)syn68k_c_stream);
              }
              else {
                parse_error(ls_00,"Untyped deref must have second arg be a quoted string C type.\n")
                ;
              }
            }
            else {
              parse_error(ls_00,"Untyped deref requires three args (ptr type, value, offset).\n");
            }
          }
          else {
            iVar6 = list_length(ls_00);
            if (iVar6 == 2) {
              if ((ls_00->token).u.reginfo.size == '\x04') {
                uVar8 = 0x55;
                if ((ls_00->token).u.reginfo.sgnd != '\0') {
                  uVar8 = 0x53;
                }
                fprintf((FILE *)syn68k_c_stream,"READ%cL_UNSWAPPED ((CLEAN (",uVar8);
              }
              else {
                fprintf((FILE *)syn68k_c_stream,"DEREF(%s, SYN68K_TO_US (CLEAN (",
                        ctypes[(ls_00->token).u.reginfo.sgnd][(ls_00->token).u.reginfo.size]);
              }
              generate_code_for_list(ls_00->cdr,m68kop,info,(CCVariant *)buf._504_8_);
              fputs("))) ",(FILE *)syn68k_c_stream);
            }
            else {
              parse_error(ls_00,"Typed deref must have exactly one argument!\n");
            }
          }
          break;
        case TOK_SWAP:
          fputs(generate_code_for_list::swap_macro
                [(int)(uint)((ls_00->cdr->token).type == TOK_NUMBER)][(ls_00->token).u.reginfo.sgnd]
                [(ls_00->token).u.reginfo.size],(FILE *)syn68k_c_stream);
          generate_code_for_list(ls_00->cdr,m68kop,info,(CCVariant *)buf._504_8_);
          fputs(")) ",(FILE *)syn68k_c_stream);
          break;
        case TOK_EXPLICIT_LIST:
          for (pLStack_10 = ls_00->cdr; pLStack_10 != (List *)0x0; pLStack_10 = pLStack_10->cdr) {
            generate_code_for_list(pLStack_10,m68kop,info,(CCVariant *)buf._504_8_);
            fputs(";\n",(FILE *)syn68k_c_stream);
            fputs("        ",(FILE *)syn68k_c_stream);
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void
generate_code_for_list (List *ls, int m68kop, const ParsedOpcodeInfo *info,
			const CCVariant *var)
{
  char buf[512];
  Token *t;
  BOOL done;

  if (ls == NULL)
    return;

  /* If they have several sublists of code, generate code for each of them. */
  t = &ls->token;
  switch (t->type) {

    /* If we've found a list, look at the operator for that list and
     * generate code appropriately. */
  case TOK_LIST:
    if (ls->car == NULL)
      return;
    ls = ls->car;
    t = &ls->token;

    switch (ls->token.type) {
    case TOK_EXPLICIT_LIST:
      /* Loop over all the lists of code and generate c for them. */
      for (ls = ls->cdr; ls != NULL; ls = ls->cdr)
	{
	  generate_code_for_list (ls, m68kop, info, var);
	  fputs (";\n", syn68k_c_stream);
	  fputs ("        ", syn68k_c_stream);
	}
      break;

    case TOK_ASSIGN:
      putc ('(', syn68k_c_stream);
      done = FALSE;

      /* If they are writing out to a long, generate appropriate code
       * that will work on a QUADALIGN machine.
       */
      if (ls->cdr->token.type == TOK_LIST
	  && CADR (ls)->token.type == TOK_DEREF
	  && CADR (ls)->token.u.derefinfo.size == 4)
	{
	  fprintf (syn68k_c_stream,
		   "WRITE%cL_UNSWAPPED (SYN68K_TO_US (CLEAN (",
		   CADR (ls)->token.u.derefinfo.sgnd ? 'S' : 'U');
	  generate_code_for_list (CDADR (ls), m68kop, info, var);
	  fputs (")), ", syn68k_c_stream);
	  generate_code_for_list (CDDR (ls), m68kop, info, var);
	  fputs (") ", syn68k_c_stream);
	  done = TRUE;
	}
      if ((ls->cdr->token.type == TOK_AMODE
	   || ls->cdr->token.type == TOK_REVERSED_AMODE
	   || ls->cdr->token.type == TOK_DOLLAR_AMODE
	   || ls->cdr->token.type == TOK_DOLLAR_REVERSED_AMODE)
	  && ls->cdr->token.u.amodeinfo.size == 4)
	{
	  fprintf (syn68k_c_stream,
		   "WRITE%cL_UNSWAPPED (SYN68K_TO_US (CLEAN (",
		   ls->cdr->token.u.derefinfo.sgnd ? 'S' : 'U');
	  switch (ls->cdr->token.type) {
	  case TOK_DOLLAR_AMODE:
	    fputs (" (cpu_state.amode_p) ", syn68k_c_stream);
	    break;
	  case TOK_DOLLAR_REVERSED_AMODE:
	    fputs (" (cpu_state.reversed_amode_p) ",
		   syn68k_c_stream);
	    break;
	  case TOK_AMODE:
	    ls->cdr->token.type = TOK_AMODE_PTR;
	    generate_code_for_list (ls->cdr, m68kop, info, var);
	    ls->cdr->token.type = TOK_AMODE;
	    break;
	  case TOK_REVERSED_AMODE:
	  default:
	    ls->cdr->token.type = TOK_REVERSED_AMODE_PTR;
	    generate_code_for_list (ls->cdr, m68kop, info, var);
	    ls->cdr->token.type = TOK_REVERSED_AMODE;
	    break;
	  }
	  fputs (")), ", syn68k_c_stream);
	  generate_code_for_list (CDDR (ls), m68kop, info, var);
	  fputs (") ", syn68k_c_stream);
	  done = TRUE;
	}


      /* Do stuff like (assign d0.ul.n (+ d0.ul.n 5)) -> "d0.ul.n += 5" */
      if (!done && CDDR (ls)->token.type == TOK_LIST
	  && list_length (CADDR (ls)) == 3
	  && tokens_equal (&CDR (CADDR (ls))->token, &CDR (ls)->token))
	{
	  if (CDR (ls)->token.type != TOK_LIST
	      || lists_equal (CADR (ls), CADR (CADDR (ls))))
	    {
	      switch (CADDR (ls)->token.type) {
	      case TOK_BITWISE_AND:
	      case TOK_BITWISE_OR:
	      case TOK_BITWISE_XOR:
	      case TOK_PLUS:
	      case TOK_MINUS:
	      case TOK_MULTIPLY:
	      case TOK_DIVIDE:
	      case TOK_MOD:
	      case TOK_SHIFT_LEFT:
	      case TOK_SHIFT_RIGHT:
		/* Word-sized operations to address registers deal with
		 * the entire address register; the RHS is sign extended.
		 */
		if (ls->cdr->token.type == TOK_ADDRESS_REGISTER
		    && ls->cdr->token.u.reginfo.size == 2)
		  {
		    ls->cdr->token.u.reginfo.size = 4;
		    generate_code_for_list (ls->cdr, m68kop, info, var);
		    fputs (unparse_token (&CADDR (ls)->token, buf),
			   syn68k_c_stream);
		    fputs ("= (int16)", syn68k_c_stream);
		    generate_code_for_list (CDDR (CADDR (ls)), m68kop,
					    info, var);
		  }
		else  /* Not a word-sized op to an address register. */
		  {
		    TokenType optype = CADDR (ls)->token.type;

		    /* Change foo += 1 to ++foo.  Why?  It turns out
		     * that gcc sometimes generates better code for ++foo.
		     * Annoying, isn't it?
		     */
		    if ((optype == TOK_PLUS || optype == TOK_MINUS)
			&& CDDR (CADDR (ls))->token.type == TOK_NUMBER
			&& (CDDR (CADDR (ls))->token.u.n == 1
			    || CDDR (CADDR (ls))->token.u.n == -1))
		      {
			if ((optype == TOK_PLUS)
			    ^ (CDDR (CADDR (ls))->token.u.n == -1))
			  fputs ("(++", syn68k_c_stream);
			else
			  fputs ("(--", syn68k_c_stream);
			generate_code_for_list (ls->cdr, m68kop, info, var);
			fputs (") ", syn68k_c_stream);
		      }
		    /* Change foo += 5 to a weird macro...this also seems
		     * to help gcc.
		     */
		    else if ((optype == TOK_PLUS || optype == TOK_MINUS)
			     && CDDR (CADDR (ls))->token.type == TOK_NUMBER
			     && ls->cdr->token.u.reginfo.size == 4
			     && ls->cdr->token.u.n != (int32) 0x80000000)
		      {
			int32 val = CDDR (CADDR (ls))->token.u.n;
			if (val >= 0)
			  {
			    if (optype == TOK_PLUS)
			      fputs ("(INC_VAR (", syn68k_c_stream);
			    else
			      fputs ("(DEC_VAR (", syn68k_c_stream);
			    generate_code_for_list (ls->cdr, m68kop, info,
						    var);
			    fprintf (syn68k_c_stream, ", %ld)) ", (long) val);
			  }
			else  /* val < 0 */
			  {
			    if (optype == TOK_PLUS)
			      fputs ("(DEC_VAR (", syn68k_c_stream);
			    else
			      fputs ("(INC_VAR (", syn68k_c_stream);
			    generate_code_for_list (ls->cdr, m68kop, info,
						    var);
			    fprintf (syn68k_c_stream, ", %ld)) ", (long) -val);
			  }
		      }
		    else
		      {
			generate_code_for_list (ls->cdr, m68kop, info, var);
			fputs (unparse_token (&CADDR (ls)->token, buf),
			       syn68k_c_stream);
			fputs ("= ", syn68k_c_stream);
			generate_code_for_list (CDDR (CADDR (ls)), m68kop,
						info, var);
		      }
		  }
		done = TRUE;
		break;
	      default:
		break;
	      }
	    }
	}

      /* See if we are assigning something to itself.  This can happen
       * when expanding out code, and gcc hasn't been eliminating these
       * pointless assigns.  Here we just output the LHS of the assignment,
       * in case the value of the assignment as a whole is being used for
       * something (eg, "d0.ul.n = d0.ul.n"  ->  "d0.ul.n")
       */
      if (!done)
	{
	  if (tokens_equal (&ls->cdr->token, &(CDDR (ls))->token)
	      && lists_equal (CADR (ls), CADDR (ls)))
	    {
	      generate_code_for_list (ls->cdr, m68kop, info, var);
	      done = TRUE;
	    }
	}

      if (!done)
	{
	  /* Force word moves into address registers to be sign extended. */
	  if (ls->cdr->token.type == TOK_ADDRESS_REGISTER
	      && ls->cdr->token.u.reginfo.size == 2)
	    {
	      ls->cdr->token.u.reginfo.size = 4;
	      generate_code_for_list (ls->cdr, m68kop, info, var);
	      fputs ("= (int16) ", syn68k_c_stream);
	    }
	  else
	    {
	      generate_code_for_list (ls->cdr, m68kop, info, var);
	      fputs ("= ", syn68k_c_stream);
	    }
	  generate_code_for_list (CDDR (ls), m68kop, info, var);
	}
      fputs (") ", syn68k_c_stream);
      break;

      /* Have to special case boolean xor since C doesn't have ^^ analagous to
       * && and ||.
       */
    case TOK_XOR:
      for (ls = ls->cdr; ls != NULL; ls = ls->cdr)
	{
	  fputs ("(!", syn68k_c_stream);
	  generate_code_for_list (ls, m68kop, info, var);
	  fputs (") ", syn68k_c_stream);
	  if (ls->cdr != NULL)
	    fputs ("^ ", syn68k_c_stream);
	}
      break;
    case TOK_NOT:
      if (ls->cdr == NULL)
	{
	  parse_error (ls, "\"not\" missing an argument!\n");
	  fputs ("0 ", syn68k_c_stream);
	}
      else
	{
	  fputs ("(!", syn68k_c_stream);
	  generate_code_for_list (ls->cdr, m68kop, info, var);
	  fputs (") ", syn68k_c_stream);
	}
      break;

    case TOK_BITWISE_NOT:
      if (ls->cdr == NULL)
	{
	  parse_error (ls, "\"~\" missing an argument!\n");
	  fputs ("0 ", syn68k_c_stream);
	}
      else
	{
	  fputs ("(~", syn68k_c_stream);
	  generate_code_for_list (ls->cdr, m68kop, info, var);
	  fputs (") ", syn68k_c_stream);
	}
      break;

    case TOK_AND:
      binary_op_list ("&&", ls->cdr, m68kop, info, var);
      break;
    case TOK_OR:
      binary_op_list ("||", ls->cdr, m68kop, info, var);
      break;
    case TOK_EQUAL:
      binary_op_list ("==", ls->cdr, m68kop, info, var);  /* 2 args but OK. */
      break;
    case TOK_NOT_EQUAL:
      binary_op_list ("!=", ls->cdr, m68kop, info, var);  /* 2 args but OK. */
      break;
    case TOK_GREATER_THAN:
    case TOK_LESS_THAN:
    case TOK_GREATER_OR_EQUAL:
    case TOK_PLUS:
    case TOK_MINUS:
    case TOK_LESS_OR_EQUAL:
    case TOK_MULTIPLY:
    case TOK_DIVIDE:
    case TOK_MOD:
    case TOK_BITWISE_AND:
    case TOK_BITWISE_OR:
    case TOK_BITWISE_XOR:
      unparse_token (&ls->token, buf);
      binary_op_list (buf, ls->cdr, m68kop, info, var);
      break;

    case TOK_SHIFT_LEFT:
    case TOK_SHIFT_RIGHT:
      unparse_token (&ls->token, buf);
      binary_op_list (buf, ls->cdr, m68kop, info, var);
      break;

    case TOK_DEFAULT:
      fputs ("default ", syn68k_c_stream);
      break;

    case TOK_SWITCH:
      fputs ("switch (", syn68k_c_stream);
      generate_code_for_list (ls->cdr, m68kop, info, var);
      fputs (") {\n", syn68k_c_stream);
      for (ls = CDDR (ls); ls != NULL; ls = ls->cdr)
	{
	  if (ls->car->token.type == TOK_DEFAULT)
	    fputs ("        default: ", syn68k_c_stream);
	  else
	    {
	      fputs ("        case ", syn68k_c_stream);
	      generate_code_for_list (ls->car, m68kop, info, var);
	      fputs (": ", syn68k_c_stream);
	    }
	  generate_code_for_list (CDAR (ls), m68kop, info, var);
	  fputs ("; break;\n", syn68k_c_stream);
	}
      fputs ("}\n        ", syn68k_c_stream);
      break;

    case TOK_IF:
      fputs ("if (", syn68k_c_stream);
      generate_code_for_list (ls->cdr, m68kop, info, var);
      fputs (") { ", syn68k_c_stream);
      generate_code_for_list (CDDR (ls), m68kop, info, var);
      fputs (";} ", syn68k_c_stream);
      if (CDDDR (ls) != NULL)
	{
	  fputs ("else { ", syn68k_c_stream);
	  generate_code_for_list (CDDDR (ls), m68kop, info, var);
	  fputs (";} ", syn68k_c_stream);
	}
      break;

    case TOK_SWAP:
      {
	static const char *swap_macro[2][2][5] = {
	  {{ "ERR", "((uint8) (", "(SWAPUW_IFLE (", "ERR", "(SWAPUL_IFLE (" },
	   { "ERR", "((int8) (",  "(SWAPSW_IFLE (", "ERR", "(SWAPSL_IFLE (" }},
	  {{ "ERR", "((uint8) (", "(SWAPUW_IFLE (", "ERR",
	       "(SWAPUL_IFLE (" },
	   { "ERR", "((int8) (",  "(SWAPSW_IFLE (", "ERR",
	       "(SWAPSL_IFLE (" }}
	};

	fputs (swap_macro[(ls->cdr->token.type == TOK_NUMBER)]
			  [t->u.swapinfo.sgnd][t->u.swapinfo.size],
	       syn68k_c_stream);
	generate_code_for_list (ls->cdr, m68kop, info, var);
	fputs (")) ", syn68k_c_stream);
      }
      break;

    case TOK_CAST:
      if (ls->cdr == NULL || ls->cdr->token.type != TOK_QUOTED_STRING)
	{
	  parse_error (ls, "\"cast\" must be followed by a C type "
		       "in quotes.\n");
	}
      else
	{
	  fprintf (syn68k_c_stream, "((%s) ", ls->cdr->token.u.string);
	  generate_code_for_list (CDDR (ls), m68kop, info, var);
	  fputs (") ", syn68k_c_stream);
	}
      break;

    case TOK_DEREF:
      if (t->u.derefinfo.size == 0)  /* Untyped deref? */
	{
	  if (list_length (ls) != 4)
	    parse_error (ls, "Untyped deref requires three args (ptr type, "
			 "value, offset).\n");
	  else if (ls->cdr->token.type != TOK_QUOTED_STRING)
	    parse_error (ls, "Untyped deref must have second arg be "
			 "a quoted string C type.\n");
	  else
	    {
	      /* We intentionally leave out the CLEAN here; you don't
	       * want to CLEAN the code pointer, for instance!  In general
	       * if you use an untyped deref you have to be more careful...
	       */
	      fprintf (syn68k_c_stream, "(*(((%s) ",
		       ls->cdr->token.u.string);
	      generate_code_for_list (CDDR (ls), m68kop, info, var);
	      fputs (") + ", syn68k_c_stream);
	      generate_code_for_list (CDDDR (ls), m68kop, info, var);
	      fputs (")) ", syn68k_c_stream);
	    }
	}
      else
	{
	  if (list_length (ls) != 2)
	    parse_error (ls, "Typed deref must have exactly one argument!\n");
	  else
	    {
	      if (t->u.derefinfo.size != 4)
		fprintf (syn68k_c_stream, "DEREF(%s, SYN68K_TO_US (CLEAN (",
			 ctypes[t->u.derefinfo.sgnd][t->u.derefinfo.size]);
	      else
		fprintf (syn68k_c_stream,
			 "READ%cL_UNSWAPPED ((CLEAN (",
			 t->u.derefinfo.sgnd ? 'S' : 'U');
	      generate_code_for_list (ls->cdr, m68kop, info, var);
	      fputs ("))) ", syn68k_c_stream);
	    }
	}
      break;

    case TOK_FUNC_CALL:
      if (ls->cdr == NULL || ls->cdr->token.type != TOK_QUOTED_STRING)
	{
	  parse_error (ls, "\"call\" must be followed by a function name "
		       "in quotes.\n");
	}
      else
	{
	  List *l2;
	  fprintf (syn68k_c_stream, "%s (", ls->cdr->token.u.string);
	  for (l2 = CDDR (ls); l2 != NULL; l2 = l2->cdr)
	    {
	      generate_code_for_list (l2, m68kop, info, var);
	      if (l2->cdr != NULL)
		fputs (", ", syn68k_c_stream);
	    }
	  fputs (") ", syn68k_c_stream);
	}
      break;

      /* Skip NOPs, however they were introduced. */
    case TOK_NOP:
      break;

    default:
      parse_error (ls, "Unknown operator for code list: %s\n",
		   unparse_token (&ls->token, buf));
      break;
    }
    break;

    /* Skip NOPs, however they were introduced. */
  case TOK_NOP:
    break;

  case TOK_TRUE:
    fputs ("1 ", syn68k_c_stream);
    break;

  case TOK_FALSE:
    fputs ("0 ", syn68k_c_stream);
    break;

  case TOK_CODE:
    fputs ("code ", syn68k_c_stream);
    break;

  case TOK_DOLLAR_DATA_REGISTER:
    {
      Token temp = *t;
      /* Compensate for gcc i386 brain damage. */
      fprintf (syn68k_c_stream, "DATA_REGISTER_%c%c (",
	       t->u.dollarinfo.sgnd ? 'S' : 'U',
	       "?BW?L"[t->u.dollarinfo.size]);
      t->type = TOK_DOLLAR_NUMBER;
      t->u.dollarinfo.sgnd = FALSE;
      t->u.dollarinfo.size = 4;
      generate_code_for_list (ls, m68kop, info, var);
      *t = temp;
      fputs (") ", syn68k_c_stream);
    }
    break;

  case TOK_DOLLAR_ADDRESS_REGISTER:
    {
      Token temp = *t;
      fprintf (syn68k_c_stream, "ADDRESS_REGISTER_%c%c ( ",
	       t->u.dollarinfo.sgnd ? 'S' : 'U',
	       "?BW?L"[t->u.dollarinfo.size]);
      t->type = TOK_DOLLAR_NUMBER;
      t->u.dollarinfo.sgnd = FALSE;
      t->u.dollarinfo.size = 4;
      generate_code_for_list (ls, m68kop, info, var);
      *t = temp;
      fputs (") ", syn68k_c_stream);
    }
    break;

  case TOK_DOLLAR_GENERAL_REGISTER:
    {
      Token temp = *t;
      fprintf (syn68k_c_stream, "GENERAL_REGISTER_%c%c (",
	       t->u.dollarinfo.sgnd ? 'S' : 'U',
	       "?BW?L"[t->u.dollarinfo.size]);
      t->type = TOK_DOLLAR_NUMBER;
      t->u.dollarinfo.sgnd = FALSE;
      t->u.dollarinfo.size = 4;
      generate_code_for_list (ls, m68kop, info, var);
      *t = temp;
      fputs (") ", syn68k_c_stream);
    }
    break;

  case TOK_TEMP_REGISTER:
    fprintf (syn68k_c_stream, "tmp%d%s ", t->u.reginfo.which,
	     regdesc[t->u.reginfo.sgnd][t->u.reginfo.size]);
    break;

  case TOK_DATA_REGISTER:
    fprintf (syn68k_c_stream, "DATA_REGISTER_%c%c (%d) ",
	     t->u.dollarinfo.sgnd ? 'S' : 'U',
	     "?BW?L"[t->u.dollarinfo.size],
	     t->u.reginfo.which);
    break;

  case TOK_ADDRESS_REGISTER:
    fprintf (syn68k_c_stream, "ADDRESS_REGISTER_%c%c (%d) ",
	     t->u.dollarinfo.sgnd ? 'S' : 'U',
	     "?BW?L"[t->u.dollarinfo.size],
	     t->u.reginfo.which);
    break;

  case TOK_AMODE_PTR:
  case TOK_REVERSED_AMODE_PTR:
    fputs ("(US_TO_SYN68K (", syn68k_c_stream);
    output_c_for_amode_ptr (t, (t->type == TOK_REVERSED_AMODE_PTR));
    fputs ("))", syn68k_c_stream);
    break;

  case TOK_AMODE:
  case TOK_REVERSED_AMODE:
    if (t->u.dollarinfo.size != 4)
      {
	fprintf (syn68k_c_stream, "DEREF(%s, CLEAN (",
		 ctypes[t->u.dollarinfo.sgnd][t->u.dollarinfo.size]);
	output_c_for_amode_ptr (t, (t->type == TOK_REVERSED_AMODE));
	fputs (")) ", syn68k_c_stream);
      }
    else
      {
#if 0
	fputs ("\n"
	       "#ifdef QUADALIGN\n"
	       "# ifdef BIGENDIAN\n", syn68k_c_stream);

	fprintf (syn68k_c_stream, "((%s) (((((uint16 *) CLEAN (",
		 ctypes[t->u.dollarinfo.sgnd][t->u.dollarinfo.size]);
	output_c_for_amode_ptr (t, (t->type == TOK_REVERSED_AMODE));
	fputs ("))[0]) << 16) | (((uint16 *) CLEAN (", syn68k_c_stream);
	output_c_for_amode_ptr (t, (t->type == TOK_REVERSED_AMODE));
	fputs ("))[1])))\n", syn68k_c_stream);
	
	fputs ("# else\n", syn68k_c_stream);
	
	fprintf (syn68k_c_stream, "((%s) ((((uint16 *) CLEAN (",
		 ctypes[t->u.dollarinfo.sgnd][t->u.dollarinfo.size]);
	output_c_for_amode_ptr (t, (t->type == TOK_REVERSED_AMODE));
	fputs ("))[0]) | ((((uint16 *) CLEAN (", syn68k_c_stream);
	output_c_for_amode_ptr (t, (t->type == TOK_REVERSED_AMODE));
	fputs ("))[1]) << 16)))\n", syn68k_c_stream);

	fputs ("# endif\n"
	       "#else\n", syn68k_c_stream);
	fprintf (syn68k_c_stream, "(*(%s *) CLEAN (",
		 ctypes[t->u.dollarinfo.sgnd][t->u.dollarinfo.size]);
	output_c_for_amode_ptr (t, (t->type == TOK_REVERSED_AMODE));
	fputs (")) ", syn68k_c_stream);
	fputs ("\n#endif\n", syn68k_c_stream);
#else
	fprintf (syn68k_c_stream, "READ%cL_UNSWAPPED (CLEAN",
		 t->u.dollarinfo.sgnd ? 'S' : 'U');
	output_c_for_amode_ptr (t, (t->type == TOK_REVERSED_AMODE));
	fputs (") ", syn68k_c_stream);
#endif
      }
    break;

  case TOK_NUMBER:
    if (t->u.n >= 100 || t->u.n <= -100)
      fprintf (syn68k_c_stream, "((int32) 0x%lX) ", (unsigned long)t->u.n);
    else fprintf (syn68k_c_stream, "%ld ", t->u.n);
    break;

    /* Pass quoted strings on to the C compiler. */
  case TOK_QUOTED_STRING:
    fprintf (syn68k_c_stream, "%s ", t->u.string);  /* Append a space. */
    break;

  case TOK_CCC:  fputs ("cpu_state.ccc ",  syn68k_c_stream); break;
  case TOK_CCN:  fputs ("cpu_state.ccn ",  syn68k_c_stream); break;
  case TOK_CCV:  fputs ("cpu_state.ccv ",  syn68k_c_stream); break;
  case TOK_CCX:  fputs ("cpu_state.ccx ",  syn68k_c_stream); break;
  case TOK_CCNZ: fputs ("cpu_state.ccnz ", syn68k_c_stream); break;

    /* If we still haven't been able to resolve the addressing mode,
     * a pointer to the data should have been put in the appropriate
     * local variable by a preceding instruction.
     */
  case TOK_DOLLAR_AMODE:
    if (t->u.dollarinfo.size != 4)
      fprintf (syn68k_c_stream, "DEREF(%s, SYN68K_TO_US(cpu_state.amode_p)) ",
	       ctypes[t->u.dollarinfo.sgnd][t->u.dollarinfo.size]);
    else
      fprintf (syn68k_c_stream, "READ%cL_UNSWAPPED ( (cpu_state.amode_p)) ",
	       t->u.dollarinfo.sgnd ? 'S' : 'U');
    break;

  case TOK_DOLLAR_REVERSED_AMODE:
    if (t->u.dollarinfo.size != 4)
      fprintf (syn68k_c_stream, "DEREF(%s, SYN68K_TO_US(cpu_state.reversed_amode_p)) ",
	       ctypes[t->u.dollarinfo.sgnd][t->u.dollarinfo.size]);
    else
      fprintf (syn68k_c_stream,
	       "READ%cL_UNSWAPPED ( (cpu_state.reversed_amode_p)) ",
	       t->u.dollarinfo.sgnd ? 'S' : 'U');
    break;

  case TOK_DOLLAR_AMODE_PTR:
    fprintf (syn68k_c_stream, " (cpu_state.amode_p) ");
    break;

  case TOK_DOLLAR_REVERSED_AMODE_PTR:
    fprintf (syn68k_c_stream, " (cpu_state.reversed_amode_p) ");
    break;

  case TOK_DOLLAR_NUMBER:
#if	1 || !defined(TEMPS_AT_TOP)
    fprintf (syn68k_c_stream, "operand_%d ", t->u.dollarinfo.which);
#else	/* defined(TEMPS_AT_TOP) */
    fprintf (syn68k_c_stream, "operand_%s%d_%d ",
				t->u.dollarinfo.sgnd ? "" : "u",
				t->u.dollarinfo.size*8, t->u.dollarinfo.which);
#endif	/* defined(TEMPS_AT_TOP) */
    break;

  default:
    parse_error (ls, "Unknown code element: %s\n", unparse_token (t, buf));
    break;
  }
}